

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::defineForthWords(Forth *this)

{
  undefined *__s;
  allocator<char> local_39;
  string local_38;
  undefined *local_18;
  char *line;
  Forth *this_local;
  
  __s = forthDefinitions;
  local_18 = forthDefinitions;
  line = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  SetInput(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  interpret(this);
  return;
}

Assistant:

void defineForthWords() {
				auto line = forthDefinitions;
				SetInput( line );
				interpret();
		}